

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

double __thiscall UnitBoundedPolynomial1<3U>::interpolate(UnitBoundedPolynomial1<3U> *this,double t)

{
  int k;
  long lVar1;
  double y;
  double dVar2;
  double tt;
  
  tt = 1.0;
  dVar2 = 0.0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    dVar2 = dVar2 + this->coeffs[lVar1] * tt;
    tt = tt * t;
  }
  return dVar2;
}

Assistant:

double UnitBoundedPolynomial1<Order>::interpolate(double t) const
{
    double y = 0.0, tt = 1;

    for (int k = 0; k <= Order; ++k)
    {
        y += coeffs[k] * tt;
        tt *= t;
    }

    return y;
}